

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_grid_mesh.cpp
# Opt level: O3

void __thiscall embree::GridMesh::commit(GridMesh *this)

{
  BufferView<embree::Vec3fa> *pBVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  uVar3 = (ulong)(this->super_Geometry).numTimeSteps;
  if (uVar3 != 0) {
    pBVar1 = (this->vertices).items;
    lVar4 = 0;
    do {
      if (*(int *)((long)&(pBVar1->super_RawBufferView).stride + lVar4) !=
          (int)(pBVar1->super_RawBufferView).stride) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,
                   "stride of vertex buffers have to be identical for each time step","");
        *puVar2 = &PTR__rtcore_error_02184a18;
        *(undefined4 *)(puVar2 + 1) = 3;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_38,local_38 + local_30);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
      lVar4 = lVar4 + 0x38;
    } while (uVar3 * 0x38 - lVar4 != 0);
  }
  Geometry::commit(&this->super_Geometry);
  return;
}

Assistant:

void GridMesh::commit()
  {
    /* verify that stride of all time steps are identical */
    for (unsigned int t=0; t<numTimeSteps; t++) {
      if (vertices[t].getStride() != vertices[0].getStride())
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"stride of vertex buffers have to be identical for each time step");
      if (vertices[t]) vertices[t].buffer->commitIfNeeded();
    }
    if (grids) grids.buffer->commitIfNeeded();
#if defined(EMBREE_SYCL_SUPPORT)
    
    /* build quadID_to_primID_xy mapping when hardware ray tracing is supported */
    DeviceGPU* gpu_device = dynamic_cast<DeviceGPU*>(device);
    if (gpu_device)
    {
      const size_t numQuads = getNumTotalQuads();
      quadID_to_primID_xy.resize(numQuads);
      
      for (uint32_t primID=0, quadID=0; primID<size(); primID++)
      {
        const Grid& g = grid(primID);
        for (ssize_t y=0; y<ssize_t(g.resY)-1; y++)
          for (ssize_t x=0; x<ssize_t(g.resX)-1; x++)
            quadID_to_primID_xy[quadID++] = { primID, (uint16_t) x, (uint16_t) y };
      }
    }

#endif
    
    Geometry::commit();
  }